

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

void mriStep_DisableLSetup(ARKodeMem ark_mem)

{
  int iVar1;
  ARKodeMem in_RDI;
  int retval;
  ARKodeMRIStepMem step_mem;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  
  iVar1 = mriStep_AccessStepMem
                    (in_RDI,in_stack_fffffffffffffff0,
                     (ARKodeMRIStepMem *)
                     CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (iVar1 == 0) {
    in_stack_fffffffffffffff0[0x148] = '\0';
    in_stack_fffffffffffffff0[0x149] = '\0';
    in_stack_fffffffffffffff0[0x14a] = '\0';
    in_stack_fffffffffffffff0[0x14b] = '\0';
    in_stack_fffffffffffffff0[0x14c] = '\0';
    in_stack_fffffffffffffff0[0x14d] = '\0';
    in_stack_fffffffffffffff0[0x14e] = '\0';
    in_stack_fffffffffffffff0[0x14f] = '\0';
  }
  return;
}

Assistant:

void mriStep_DisableLSetup(ARKodeMem ark_mem)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return; }

  /* nullify the lsetup function pointer */
  step_mem->lsetup = NULL;
}